

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

void __thiscall Client::run(Client *this)

{
  char **ppcVar1;
  __pid_t _Var2;
  uint uVar3;
  int iVar4;
  epoll_event *peVar5;
  ulong extraout_RAX;
  ssize_t sVar6;
  uint *puVar7;
  int *piVar8;
  Buff *pBVar9;
  char *pcVar10;
  Buff *pBVar11;
  size_t sVar12;
  Client *pCVar13;
  ulong uVar14;
  Client *pCVar15;
  int iVar16;
  uint uVar17;
  bool bVar18;
  
  Epoll::add_event(&this->_epoll,this->_sock_fd,1);
  Epoll::add_event(&this->_epoll,0,1);
  do {
    do {
      _Var2 = Epoll::wait(&this->_epoll,(void *)0x3e8);
    } while (_Var2 < 1);
    iVar16 = 0;
    do {
      peVar5 = Epoll::get(&this->_epoll,iVar16);
      if ((peVar5->events & 1) == 0) {
        if (((peVar5->events & 4) != 0) && (run(), (extraout_RAX & 1) == 0)) {
          return;
        }
      }
      else {
        uVar17 = (peVar5->data).fd;
        fprintf(_stderr,"%s(%d)-<%s>: epollin fd %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                ,0x3c,"run",(ulong)uVar17);
        fflush(_stderr);
        uVar3 = do_recv(this,uVar17);
        if (uVar3 == 0) {
          uVar3 = this->_sock_fd;
          if (uVar17 == 0) {
LAB_00101f87:
            Epoll::modify_event(&this->_epoll,uVar3,4);
          }
          else if (uVar17 == uVar3) {
            Epoll::add_event(&this->_epoll,1,4);
          }
        }
        else {
          if (0xfffffffd < uVar3) {
            return;
          }
          if (uVar3 == 0xfffffffa) {
            if ((uVar17 == 0) && ((this->_stdin2sock)._r_pos != (this->_stdin2sock)._w_pos)) {
              uVar3 = this->_sock_fd;
              goto LAB_00101f87;
            }
            if (((uVar17 == this->_sock_fd) &&
                ((this->_sock2stdout)._r_pos != (this->_sock2stdout)._w_pos)) &&
               (iVar4 = Epoll::add_event(&this->_epoll,1,4), iVar4 < 0)) {
              uVar14 = 1;
              pCVar15 = this;
              iVar4 = Epoll::modify_event(&this->_epoll,1,4);
              if (iVar4 < 0) {
                run();
                iVar16 = (int)uVar14;
                pCVar13 = (Client *)(uVar14 & 0xffffffff);
                if (pCVar15->_sock_fd == iVar16) {
                  pcVar10 = (pCVar15->_sock2stdout)._r_pos;
                  sVar12 = (long)pCVar15 + (0x1058 - (long)pcVar10);
                  if ((sVar12 == 0) ||
                     ((bVar18 = iVar16 == 0, bVar18 &&
                      (&(pCVar15->_stdin2sock)._r_pos == (char **)(pCVar15->_stdin2sock)._r_pos))))
                  {
                    do_recv();
                    return;
                  }
                  sVar6 = read(iVar16,pcVar10,sVar12);
                  uVar17 = (uint)sVar6;
LAB_00102031:
                  if (-1 < (int)uVar17) {
                    if (uVar17 == 0) {
                      if (pCVar15->_sock_fd == iVar16) {
                        do_recv(pCVar15);
                      }
                      else if (bVar18) {
                        do_recv();
                      }
                    }
                    else {
                      fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                              ,0xc6,"do_recv",pCVar13,uVar17);
                      fflush(_stderr);
                      if (pCVar15->_sock_fd == iVar16) {
                        ppcVar1 = &(pCVar15->_sock2stdout)._r_pos;
                        *ppcVar1 = *ppcVar1 + (uVar17 & 0x7fffffff);
                      }
                      else if (bVar18) {
                        ppcVar1 = &(pCVar15->_stdin2sock)._r_pos;
                        *ppcVar1 = *ppcVar1 + (uVar17 & 0x7fffffff);
                      }
                    }
                    return;
                  }
                  puVar7 = (uint *)__errno_location();
                  pCVar15 = (Client *)(ulong)*puVar7;
                  if (*puVar7 == 0xb) {
                    return;
                  }
                }
                else {
                  if (iVar16 == 0) {
                    pcVar10 = (pCVar15->_stdin2sock)._r_pos;
                    sVar12 = (long)pCVar15 + (0x848 - (long)pcVar10);
                    if (sVar12 == 0) {
                      do_recv();
                      return;
                    }
                    sVar6 = read(0,pcVar10,sVar12);
                    uVar17 = (uint)sVar6;
                    bVar18 = true;
                    goto LAB_00102031;
                  }
                  pCVar15 = pCVar13;
                  do_recv(pCVar13);
                }
                do_recv();
                iVar16 = (int)pCVar13;
                pCVar13 = (Client *)((ulong)pCVar13 & 0xffffffff);
                if (iVar16 == 1) {
                  pcVar10 = (pCVar15->_sock2stdout)._w_pos;
                  sVar12 = (long)(pCVar15->_sock2stdout)._r_pos - (long)pcVar10;
                  if (sVar12 == 0) {
LAB_001021b4:
                    uVar17 = 0;
                    goto LAB_001021b7;
                  }
                  iVar4 = 1;
                }
                else {
                  if (pCVar15->_sock_fd != iVar16) goto LAB_001022a0;
                  pcVar10 = (pCVar15->_stdin2sock)._w_pos;
                  sVar12 = (long)(pCVar15->_stdin2sock)._r_pos - (long)pcVar10;
                  iVar4 = iVar16;
                  if (sVar12 == 0) goto LAB_001021b4;
                }
                sVar6 = write(iVar4,pcVar10,sVar12);
                uVar17 = (uint)sVar6;
                if ((int)uVar17 < 0) {
                  piVar8 = __errno_location();
                  if (*piVar8 == 0xb) {
                    return;
                  }
                  do_send();
LAB_001022a0:
                  do_send(pCVar13);
                  if (iVar16 <= (pCVar13->_epoll)._maxevents) {
                    return;
                  }
                  Epoll::get();
                  halt_baddata();
                }
LAB_001021b7:
                fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbteys: %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                        ,0xf5,"do_send",pCVar13,uVar17);
                fflush(_stderr);
                if (iVar16 == 1) {
                  pBVar9 = (Buff *)((pCVar15->_sock2stdout)._w_pos + uVar17);
                  (pCVar15->_sock2stdout)._w_pos = (char *)pBVar9;
                  pBVar11 = (Buff *)(pCVar15->_sock2stdout)._r_pos;
                  if (pBVar11 == pBVar9) {
                    pBVar9 = &pCVar15->_sock2stdout;
                    (pCVar15->_sock2stdout)._r_pos = pBVar9->_buf;
                    (pCVar15->_sock2stdout)._w_pos = pBVar9->_buf;
                    pBVar11 = pBVar9;
                  }
                  if ((pCVar15->_stdineof == true) && (pBVar11 == pBVar9)) {
                    shutdown(pCVar15->_sock_fd,0);
                  }
                }
                else if ((pCVar15->_sock_fd == iVar16) &&
                        (pcVar10 = (pCVar15->_stdin2sock)._w_pos + uVar17,
                        (pCVar15->_stdin2sock)._w_pos = pcVar10,
                        (pCVar15->_stdin2sock)._r_pos == pcVar10)) {
                  (pCVar15->_stdin2sock)._r_pos = (pCVar15->_stdin2sock)._buf;
                  (pCVar15->_stdin2sock)._w_pos = (pCVar15->_stdin2sock)._buf;
                }
                return;
              }
            }
          }
        }
      }
      iVar16 = iVar16 + 1;
    } while (_Var2 != iVar16);
  } while( true );
}

Assistant:

void Client::run()
{
    _epoll.add_event(_sock_fd, EPOLLIN);
    _epoll.add_event(STDIN_FILENO, EPOLLIN);

    
    while (true)
    {
        int nfds = _epoll.wait(kWaitMS);
        // LOG_PRINT("epoll wait get ready %d fds", nfds);

        for (int i = 0; i < nfds; ++i)
        {
            struct epoll_event &cur_ev = _epoll.get(i);

            if (cur_ev.events & EPOLLIN)
            {
                int cur_fd = cur_ev.data.fd;
                LOG_PRINT("epollin fd %d", cur_fd);
                int ret = do_recv(cur_fd);
                if (ret == err_clt_recv_normal)
                {
                    if (cur_fd == STDIN_FILENO)
                    {
                        _epoll.modify_event(_sock_fd, EPOLLOUT);
                    }
                    else if (cur_fd == _sock_fd)
                    {
                        _epoll.add_event(STDOUT_FILENO, EPOLLOUT);
                    }
                }
                else if (ret == err_clt_recv_disconn || ret == err_clt_recv_svrcrash)
                {
                    return ;
                }
                else if (ret == err_clt_recv_nospace)
                {
                    if (cur_fd == STDIN_FILENO && _stdin2sock.data_size() > 0)
                    {
                        _epoll.modify_event(_sock_fd, EPOLLOUT);
                    }
                    else if (cur_fd == _sock_fd && _sock2stdout.data_size() > 0)
                    {
                        int ret = _epoll.add_event(STDOUT_FILENO, EPOLLOUT);
                        if (ret < 0)
                        {
                            ret = _epoll.modify_event(STDOUT_FILENO, EPOLLOUT);
                            if (ret < 0)
                            {
                                LOG_PRINT("can't add or modify stdout to epoll_ctl");
                                exit(EXIT_FAILURE);
                            }
                        }
                    }
                }
            }
            else if (cur_ev.events & EPOLLOUT)
            {
                int cur_fd = cur_ev.data.fd;
                LOG_PRINT("epollout fd %d", cur_fd);

                int ret = do_send(cur_fd);

                if (ret == err_clt_send_shutdown_rd)
                {
                    return ;
                }
                else if (ret == err_clt_send_normal)
                {
                    if (cur_fd == STDOUT_FILENO)
                    {
                        _epoll.del_event(STDOUT_FILENO, EPOLLOUT);
                    }
                    else if (cur_fd == _sock_fd)
                    {
                        _epoll.modify_event(_sock_fd, EPOLLIN);
                    }
                }
            }
        }
    }
}